

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

void __thiscall
kj::StringTree::
fill<kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
          (StringTree *this,long pos,size_t branchIndex,StringTree *first,
          NoInfer<kj::ArrayPtr<const_char>_> *rest,NoInfer<kj::String> *rest_1,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_2,NoInfer<kj::ArrayPtr<const_char>_> *rest_3,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_4,NoInfer<kj::ArrayPtr<const_char>_> *rest_5,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_6,NoInfer<kj::ArrayPtr<const_char>_> *rest_7,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_8,NoInfer<kj::String> *rest_9,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_10,NoInfer<kj::CappedArray<char,_14UL>_> *rest_11
          ,NoInfer<kj::ArrayPtr<const_char>_> *rest_12,NoInfer<kj::ArrayPtr<const_char>_> *rest_13,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_14,NoInfer<kj::StringTree> *rest_15,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_16,NoInfer<kj::String> *rest_17,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_18,NoInfer<kj::ArrayPtr<const_char>_> *rest_19,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_20,NoInfer<kj::ArrayPtr<const_char>_> *rest_21,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_22,NoInfer<kj::ArrayPtr<const_char>_> *rest_23,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_24,NoInfer<kj::String> *rest_25,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_26,NoInfer<kj::CappedArray<char,_14UL>_> *rest_27
          ,NoInfer<kj::ArrayPtr<const_char>_> *rest_28,NoInfer<kj::ArrayPtr<const_char>_> *rest_29,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_30,NoInfer<kj::StringTree> *rest_31,
          NoInfer<kj::StringTree> *rest_32,NoInfer<kj::ArrayPtr<const_char>_> *rest_33,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_34,NoInfer<kj::ArrayPtr<const_char>_> *rest_35,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_36,NoInfer<kj::ArrayPtr<const_char>_> *rest_37,
          NoInfer<kj::String> *rest_38,NoInfer<kj::ArrayPtr<const_char>_> *rest_39,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_40,NoInfer<kj::ArrayPtr<const_char>_> *rest_41,
          NoInfer<kj::String> *rest_42,NoInfer<kj::ArrayPtr<const_char>_> *rest_43,
          NoInfer<kj::CappedArray<char,_14UL>_> *rest_44,NoInfer<kj::ArrayPtr<const_char>_> *rest_45
          ,NoInfer<kj::StringTree> *rest_46,NoInfer<kj::StringTree> *rest_47,
          NoInfer<kj::StringTree> *rest_48,NoInfer<kj::StringTree> *rest_49,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_50,NoInfer<kj::ArrayPtr<const_char>_> *rest_51,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_52,NoInfer<kj::ArrayPtr<const_char>_> *rest_53,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_54,NoInfer<kj::String> *rest_55,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_56,NoInfer<kj::ArrayPtr<const_char>_> *rest_57,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_58,NoInfer<kj::String> *rest_59,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_60,NoInfer<kj::CappedArray<char,_14UL>_> *rest_61
          ,NoInfer<kj::ArrayPtr<const_char>_> *rest_62,NoInfer<kj::StringTree> *rest_63)

{
  char *pcVar1;
  Branch *pBVar2;
  StringTree *pSVar3;
  ArrayPtr<const_char> *pAVar4;
  String *pSVar5;
  ArrayPtr<const_char> *pAVar6;
  ArrayPtr<const_char> *pAVar7;
  ArrayPtr<const_char> *pAVar8;
  ArrayPtr<const_char> *pAVar9;
  ArrayPtr<const_char> *pAVar10;
  ArrayPtr<const_char> *pAVar11;
  ArrayPtr<const_char> *pAVar12;
  String *pSVar13;
  ArrayPtr<const_char> *pAVar14;
  CappedArray<char,_14UL> *pCVar15;
  ArrayPtr<const_char> *pAVar16;
  ArrayPtr<const_char> *pAVar17;
  ArrayPtr<const_char> *pAVar18;
  ArrayPtr<const_char> *pAVar19;
  String *pSVar20;
  ArrayPtr<const_char> *pAVar21;
  ArrayPtr<const_char> *pAVar22;
  ArrayPtr<const_char> *pAVar23;
  ArrayPtr<const_char> *pAVar24;
  ArrayPtr<const_char> *pAVar25;
  ArrayPtr<const_char> *pAVar26;
  ArrayPtr<const_char> *pAVar27;
  String *pSVar28;
  ArrayPtr<const_char> *pAVar29;
  CappedArray<char,_14UL> *pCVar30;
  ArrayPtr<const_char> *pAVar31;
  ArrayPtr<const_char> *pAVar32;
  ArrayPtr<const_char> *pAVar33;
  StringTree *pSVar34;
  StringTree *pSVar35;
  ArrayPtr<const_char> *pAVar36;
  ArrayPtr<const_char> *pAVar37;
  ArrayPtr<const_char> *pAVar38;
  ArrayPtr<const_char> *pAVar39;
  ArrayPtr<const_char> *pAVar40;
  String *pSVar41;
  ArrayPtr<const_char> *pAVar42;
  ArrayPtr<const_char> *pAVar43;
  ArrayPtr<const_char> *pAVar44;
  String *pSVar45;
  ArrayPtr<const_char> *pAVar46;
  CappedArray<char,_14UL> *pCVar47;
  ArrayPtr<const_char> *pAVar48;
  StringTree *pSVar49;
  StringTree *pSVar50;
  StringTree *pSVar51;
  StringTree *pSVar52;
  ArrayPtr<const_char> *pAVar53;
  ArrayPtr<const_char> *pAVar54;
  ArrayPtr<const_char> *pAVar55;
  ArrayPtr<const_char> *pAVar56;
  ArrayPtr<const_char> *pAVar57;
  String *pSVar58;
  ArrayPtr<const_char> *pAVar59;
  ArrayPtr<const_char> *pAVar60;
  ArrayPtr<const_char> *pAVar61;
  String *pSVar62;
  ArrayPtr<const_char> *pAVar63;
  CappedArray<char,_14UL> *pCVar64;
  ArrayPtr<const_char> *pAVar65;
  StringTree *pSVar66;
  StringTree *pSVar67;
  NoInfer<kj::StringTree> *in_stack_000001f8;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000200;
  NoInfer<kj::String> *in_stack_00000208;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000210;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000218;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000220;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000228;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000230;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000238;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000240;
  NoInfer<kj::String> *in_stack_00000248;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000250;
  NoInfer<kj::CappedArray<char,_14UL>_> *in_stack_00000258;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000260;
  NoInfer<kj::StringTree> *in_stack_00000268;
  NoInfer<kj::StringTree> *in_stack_00000270;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000278;
  String *rest_local_1;
  ArrayPtr<const_char> *rest_local;
  StringTree *first_local;
  size_t branchIndex_local;
  char *pos_local;
  StringTree *this_local;
  
  pcVar1 = String::begin(&this->text);
  pBVar2 = Array<kj::StringTree::Branch>::operator[](&this->branches,branchIndex);
  pBVar2->index = pos - (long)pcVar1;
  pSVar3 = mv<kj::StringTree>(first);
  pBVar2 = Array<kj::StringTree::Branch>::operator[](&this->branches,branchIndex);
  operator=(&pBVar2->content,pSVar3);
  pAVar4 = fwd<kj::ArrayPtr<char_const>>(rest);
  pSVar5 = fwd<kj::String>(rest_1);
  pAVar6 = fwd<kj::ArrayPtr<char_const>>(rest_2);
  pAVar7 = fwd<kj::ArrayPtr<char_const>>(rest_3);
  pAVar8 = fwd<kj::ArrayPtr<char_const>>(rest_4);
  pAVar9 = fwd<kj::ArrayPtr<char_const>>(rest_5);
  pAVar10 = fwd<kj::ArrayPtr<char_const>>(rest_6);
  pAVar11 = fwd<kj::ArrayPtr<char_const>>(rest_7);
  pAVar12 = fwd<kj::ArrayPtr<char_const>>(rest_8);
  pSVar13 = fwd<kj::String>(rest_9);
  pAVar14 = fwd<kj::ArrayPtr<char_const>>(rest_10);
  pCVar15 = fwd<kj::CappedArray<char,14ul>>(rest_11);
  pAVar16 = fwd<kj::ArrayPtr<char_const>>(rest_12);
  pAVar17 = fwd<kj::ArrayPtr<char_const>>(rest_13);
  pAVar18 = fwd<kj::ArrayPtr<char_const>>(rest_14);
  pSVar3 = fwd<kj::StringTree>(rest_15);
  pAVar19 = fwd<kj::ArrayPtr<char_const>>(rest_16);
  pSVar20 = fwd<kj::String>(rest_17);
  pAVar21 = fwd<kj::ArrayPtr<char_const>>(rest_18);
  pAVar22 = fwd<kj::ArrayPtr<char_const>>(rest_19);
  pAVar23 = fwd<kj::ArrayPtr<char_const>>(rest_20);
  pAVar24 = fwd<kj::ArrayPtr<char_const>>(rest_21);
  pAVar25 = fwd<kj::ArrayPtr<char_const>>(rest_22);
  pAVar26 = fwd<kj::ArrayPtr<char_const>>(rest_23);
  pAVar27 = fwd<kj::ArrayPtr<char_const>>(rest_24);
  pSVar28 = fwd<kj::String>(rest_25);
  pAVar29 = fwd<kj::ArrayPtr<char_const>>(rest_26);
  pCVar30 = fwd<kj::CappedArray<char,14ul>>(rest_27);
  pAVar31 = fwd<kj::ArrayPtr<char_const>>(rest_28);
  pAVar32 = fwd<kj::ArrayPtr<char_const>>(rest_29);
  pAVar33 = fwd<kj::ArrayPtr<char_const>>(rest_30);
  pSVar34 = fwd<kj::StringTree>(rest_31);
  pSVar35 = fwd<kj::StringTree>(rest_32);
  pAVar36 = fwd<kj::ArrayPtr<char_const>>(rest_33);
  pAVar37 = fwd<kj::ArrayPtr<char_const>>(rest_34);
  pAVar38 = fwd<kj::ArrayPtr<char_const>>(rest_35);
  pAVar39 = fwd<kj::ArrayPtr<char_const>>(rest_36);
  pAVar40 = fwd<kj::ArrayPtr<char_const>>(rest_37);
  pSVar41 = fwd<kj::String>(rest_38);
  pAVar42 = fwd<kj::ArrayPtr<char_const>>(rest_39);
  pAVar43 = fwd<kj::ArrayPtr<char_const>>(rest_40);
  pAVar44 = fwd<kj::ArrayPtr<char_const>>(rest_41);
  pSVar45 = fwd<kj::String>(rest_42);
  pAVar46 = fwd<kj::ArrayPtr<char_const>>(rest_43);
  pCVar47 = fwd<kj::CappedArray<char,14ul>>(rest_44);
  pAVar48 = fwd<kj::ArrayPtr<char_const>>(rest_45);
  pSVar49 = fwd<kj::StringTree>(rest_46);
  pSVar50 = fwd<kj::StringTree>(rest_47);
  pSVar51 = fwd<kj::StringTree>(rest_48);
  pSVar52 = fwd<kj::StringTree>(rest_49);
  pAVar53 = fwd<kj::ArrayPtr<char_const>>(rest_50);
  pAVar54 = fwd<kj::ArrayPtr<char_const>>(rest_51);
  pAVar55 = fwd<kj::ArrayPtr<char_const>>(rest_52);
  pAVar56 = fwd<kj::ArrayPtr<char_const>>(rest_53);
  pAVar57 = fwd<kj::ArrayPtr<char_const>>(rest_54);
  pSVar58 = fwd<kj::String>(rest_55);
  pAVar59 = fwd<kj::ArrayPtr<char_const>>(rest_56);
  pAVar60 = fwd<kj::ArrayPtr<char_const>>(rest_57);
  pAVar61 = fwd<kj::ArrayPtr<char_const>>(rest_58);
  pSVar62 = fwd<kj::String>(rest_59);
  pAVar63 = fwd<kj::ArrayPtr<char_const>>(rest_60);
  pCVar64 = fwd<kj::CappedArray<char,14ul>>(rest_61);
  pAVar65 = fwd<kj::ArrayPtr<char_const>>(rest_62);
  pSVar66 = fwd<kj::StringTree>(rest_63);
  pSVar67 = fwd<kj::StringTree>(in_stack_000001f8);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000200);
  fwd<kj::String>(in_stack_00000208);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000210);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000218);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000220);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000228);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000230);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000238);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000240);
  fwd<kj::String>(in_stack_00000248);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000250);
  fwd<kj::CappedArray<char,14ul>>(in_stack_00000258);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000260);
  fwd<kj::StringTree>(in_stack_00000268);
  fwd<kj::StringTree>(in_stack_00000270);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000278);
  fill<kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
            (this,pos,branchIndex + 1,pAVar4,pSVar5,pAVar6,pAVar7,pAVar8,pAVar9,pAVar10,pAVar11,
             pAVar12,pSVar13,pAVar14,pCVar15,pAVar16,pAVar17,pAVar18,pSVar3,pAVar19,pSVar20,pAVar21,
             pAVar22,pAVar23,pAVar24,pAVar25,pAVar26,pAVar27,pSVar28,pAVar29,pCVar30,pAVar31,pAVar32
             ,pAVar33,pSVar34,pSVar35,pAVar36,pAVar37,pAVar38,pAVar39,pAVar40,pSVar41,pAVar42,
             pAVar43,pAVar44,pSVar45,pAVar46,pCVar47,pAVar48,pSVar49,pSVar50,pSVar51,pSVar52,pAVar53
             ,pAVar54,pAVar55,pAVar56,pAVar57,pSVar58,pAVar59,pAVar60,pAVar61,pSVar62,pAVar63,
             pCVar64,pAVar65,pSVar66,pSVar67);
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, StringTree&& first, Rest&&... rest) {
  branches[branchIndex].index = pos - text.begin();
  branches[branchIndex].content = kj::mv(first);
  fill(pos, branchIndex + 1, kj::fwd<Rest>(rest)...);
}